

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  int in_EDX;
  Fts5ExprNode *in_RSI;
  Fts5Expr *in_RDI;
  Fts5IndexIter *pIter;
  int rc;
  i64 in_stack_ffffffffffffffc8;
  Fts5IndexIter *pIndexIter;
  int local_24;
  
  pIndexIter = in_RSI->pNear->apPhrase[0]->aTerm[0].pIter;
  if (in_EDX == 0) {
    local_24 = sqlite3Fts5IterNext(pIndexIter);
  }
  else {
    local_24 = sqlite3Fts5IterNextFrom(pIndexIter,in_stack_ffffffffffffffc8);
  }
  if ((local_24 == 0) && (pIndexIter->bEof == '\0')) {
    local_24 = fts5ExprNodeTest_TERM(in_RDI,in_RSI);
  }
  else {
    in_RSI->bEof = 1;
    in_RSI->bNomatch = 0;
  }
  return local_24;
}

Assistant:

static int fts5ExprNodeNext_TERM(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc;
  Fts5IndexIter *pIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;

  assert( pNode->bEof==0 );
  if( bFromValid ){
    rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
  }else{
    rc = sqlite3Fts5IterNext(pIter);
  }
  if( rc==SQLITE_OK && sqlite3Fts5IterEof(pIter)==0 ){
    rc = fts5ExprNodeTest_TERM(pExpr, pNode);
  }else{
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return rc;
}